

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkCppSDK.h
# Opt level: O0

void tonk::WriteU32_LE(uint8_t *data,uint32_t value)

{
  uint32_t value_local;
  uint8_t *data_local;
  
  *(uint32_t *)data = value;
  return;
}

Assistant:

inline void WriteU32_LE(uint8_t* data, uint32_t value)
{
#ifdef TONK_CPP_SDK_ALIGNED_ACCESSES
    data[3] = (uint8_t)(value >> 24);
    data[2] = (uint8_t)(value >> 16);
    data[1] = (uint8_t)(value >> 8);
    data[0] = (uint8_t)value;
#else
    *(uint32_t*)data = value;
#endif
}